

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O1

void satoko_destroy(solver_t *s)

{
  vec_uint_t *pvVar1;
  cdb *__ptr;
  vec_wl_t *__ptr_00;
  watch_list *pwVar2;
  void *__ptr_01;
  vec_act_t *__ptr_02;
  heap_t *__ptr_03;
  vec_int_t *__ptr_04;
  vec_char_t *pvVar3;
  b_queue_t *pbVar4;
  ulong uVar5;
  long lVar6;
  
  pvVar1 = s->assumptions;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar1 = s->final_conflict;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  __ptr = s->all_clauses;
  free(__ptr->data);
  __ptr->data = (uint *)0x0;
  free(__ptr);
  pvVar1 = s->originals;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar1 = s->learnts;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  __ptr_00 = s->watches;
  if (__ptr_00->cap != 0) {
    lVar6 = 0x10;
    uVar5 = 0;
    do {
      pwVar2 = __ptr_00->watch_lists;
      __ptr_01 = *(void **)((long)&pwVar2->cap + lVar6);
      if (__ptr_01 != (void *)0x0) {
        free(__ptr_01);
        *(undefined8 *)((long)&pwVar2->cap + lVar6) = 0;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar5 < __ptr_00->cap);
  }
  free(__ptr_00->watch_lists);
  __ptr_00->watch_lists = (watch_list *)0x0;
  free(__ptr_00);
  __ptr_02 = s->activity;
  if (__ptr_02->data != (sdbl_t *)0x0) {
    free(__ptr_02->data);
    __ptr_02->data = (sdbl_t *)0x0;
  }
  free(__ptr_02);
  __ptr_03 = s->var_order;
  __ptr_04 = __ptr_03->indices;
  if (__ptr_04->data != (int *)0x0) {
    free(__ptr_04->data);
    __ptr_04->data = (int *)0x0;
  }
  free(__ptr_04);
  pvVar1 = __ptr_03->data;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  free(__ptr_03);
  pvVar1 = s->levels;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar1 = s->reasons;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar3 = s->assigns;
  if (pvVar3->data != (char *)0x0) {
    free(pvVar3->data);
    pvVar3->data = (char *)0x0;
  }
  free(pvVar3);
  pvVar3 = s->polarity;
  if (pvVar3->data != (char *)0x0) {
    free(pvVar3->data);
    pvVar3->data = (char *)0x0;
  }
  free(pvVar3);
  pvVar1 = s->trail;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar1 = s->trail_lim;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pbVar4 = s->bq_lbd;
  free(pbVar4->data);
  pbVar4->data = (uint *)0x0;
  free(pbVar4);
  pbVar4 = s->bq_trail;
  free(pbVar4->data);
  pbVar4->data = (uint *)0x0;
  free(pbVar4);
  pvVar1 = s->temp_lits;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar3 = s->seen;
  if (pvVar3->data != (char *)0x0) {
    free(pvVar3->data);
    pvVar3->data = (char *)0x0;
  }
  free(pvVar3);
  pvVar1 = s->tagged;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar1 = s->stack;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar1 = s->last_dlevel;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar1 = s->stamps;
  if (pvVar1->data != (uint *)0x0) {
    free(pvVar1->data);
    pvVar1->data = (uint *)0x0;
  }
  free(pvVar1);
  pvVar3 = s->marks;
  if (pvVar3 != (vec_char_t *)0x0) {
    if (pvVar3->data != (char *)0x0) {
      free(pvVar3->data);
      pvVar3->data = (char *)0x0;
    }
    free(pvVar3);
  }
  free(s);
  return;
}

Assistant:

void satoko_destroy(solver_t *s)
{
    vec_uint_free(s->assumptions);
    vec_uint_free(s->final_conflict);
    cdb_free(s->all_clauses);
    vec_uint_free(s->originals);
    vec_uint_free(s->learnts);
    vec_wl_free(s->watches);
    vec_act_free(s->activity);
    heap_free(s->var_order);
    vec_uint_free(s->levels);
    vec_uint_free(s->reasons);
    vec_char_free(s->assigns);
    vec_char_free(s->polarity);
    vec_uint_free(s->trail);
    vec_uint_free(s->trail_lim);
    b_queue_free(s->bq_lbd);
    b_queue_free(s->bq_trail);
    vec_uint_free(s->temp_lits);
    vec_char_free(s->seen);
    vec_uint_free(s->tagged);
    vec_uint_free(s->stack);
    vec_uint_free(s->last_dlevel);
    vec_uint_free(s->stamps);
    if (s->marks)
        vec_char_free(s->marks);
    satoko_free(s);
}